

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

int __thiscall JetHead::Socket::connectAsync(Socket *this,Address *addr)

{
  socklen_t __len;
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  
  __len = addr->mLen;
  uVar1 = fcntl(this->mFd,3,0);
  iVar3 = -1;
  if (-1 < (int)uVar1) {
    iVar2 = fcntl(this->mFd,4,(ulong)(uVar1 | 0x800));
    if (-1 < iVar2) {
      iVar2 = ::connect(this->mFd,(sockaddr *)addr,__len);
      piVar4 = __errno_location();
      if ((-1 < iVar2) || (*piVar4 == 0x73)) {
        this->mConnectedAsync = true;
        setConnected(this,true,5);
        iVar3 = fcntl(this->mFd,4,(ulong)uVar1);
        iVar3 = iVar3 >> 0x1f;
      }
    }
  }
  return iVar3;
}

Assistant:

int Socket::connectAsync( const Socket::Address &addr )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	int len_addr = 0;
	int res = 0;
	int saveflags, back_err;
	const struct sockaddr *saddr = addr.getAddr( len_addr );

	saveflags=fcntl(mFd,F_GETFL,0);

	if( saveflags < 0 ) {
		return -1;
	}

	/* Set non blocking */
	if(fcntl(mFd,F_SETFL,saveflags|O_NONBLOCK)<0) {
		return -1;
	}

	// Attempt it
	res = ::connect( mFd, saddr, len_addr );
	back_err=errno;

	/* return unless the connection was successful or the connect is
	still in progress. */
	if(res<0 && back_err!=EINPROGRESS) {
		return -1;
	}
	
	// Remember that we were connected in this fashion
	mConnectedAsync = true;

	// We need to hear POLLOUT once in order to inform us that the
	// socket has connected.  Once we get that once, we will want to
	// unregister for POLLOUT, otherwise we'll get it all the time.
	setConnected( true, POLLIN|POLLOUT );


	/* Turn off non-blocking */
	if(fcntl(mFd,F_SETFL,saveflags)<0) {
		return -1;
	}

	return 0;
}